

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Probe.cpp
# Opt level: O3

void __thiscall helics::apps::Probe::runTo(Probe *this,Time stopTime_input)

{
  char cVar1;
  element_type *peVar2;
  Time TVar3;
  
  peVar2 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  cVar1 = (char)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]
                [(long)&(peVar2->super_ValueFederate).vfManager._M_t];
  if (cVar1 == '\0') {
    (*(this->super_App)._vptr_App[2])(this);
  }
  else if ('\x01' < cVar1) goto LAB_001ed342;
  peVar2 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Federate::enterExecutingMode
            ((Federate *)
             ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
             (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]),NO_ITERATIONS);
LAB_001ed342:
  peVar2 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  TVar3.internalTimeCode =
       *(baseType *)
        (&(peVar2->super_ValueFederate).field_0x28 +
        (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]);
  while (TVar3.internalTimeCode <= stopTime_input.internalTimeCode) {
    runProbe(this);
    peVar2 = (this->super_App).fed.
             super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    TVar3 = Federate::requestTime
                      ((Federate *)
                       ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
                       (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]),(Time)0x0);
  }
  return;
}

Assistant:

void Probe::runTo(Time stopTime_input)
{
    auto currentMode = fed->getCurrentMode();
    if (currentMode == Federate::Modes::STARTUP) {
        initialize();
    }

    if (currentMode < Federate::Modes::EXECUTING) {
        fed->enterExecutingMode();
    }

    Time currentTime = fed->getCurrentTime();

    while (currentTime <= stopTime_input) {
        runProbe();
        currentTime = fed->requestNextStep();
    }
}